

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_partitioned_aggregate.cpp
# Opt level: O3

void __thiscall
duckdb::PartitionedAggregateLocalSinkState::~PartitionedAggregateLocalSinkState
          (PartitionedAggregateLocalSinkState *this)

{
  pointer ppEVar1;
  _Head_base<0UL,_duckdb::LocalUngroupedAggregateState_*,_false> _Var2;
  
  (this->super_LocalSinkState)._vptr_LocalSinkState =
       (_func_int **)&PTR__PartitionedAggregateLocalSinkState_01990090;
  ::std::
  vector<duckdb::unique_ptr<duckdb::AggregateFilterData,_std::default_delete<duckdb::AggregateFilterData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregateFilterData,_std::default_delete<duckdb::AggregateFilterData>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::AggregateFilterData,_std::default_delete<duckdb::AggregateFilterData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregateFilterData,_std::default_delete<duckdb::AggregateFilterData>,_true>_>_>
             *)&(this->execute_state).filter_set);
  DataChunk::~DataChunk(&(this->execute_state).aggregate_input_chunk);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
  ::~vector(&(this->execute_state).child_executor.states.
             super_vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
           );
  ppEVar1 = (this->execute_state).child_executor.expressions.
            super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
            super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppEVar1 != (pointer)0x0) {
    operator_delete(ppEVar1);
  }
  _Var2._M_head_impl =
       (this->state).
       super_unique_ptr<duckdb::LocalUngroupedAggregateState,_std::default_delete<duckdb::LocalUngroupedAggregateState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::LocalUngroupedAggregateState,_std::default_delete<duckdb::LocalUngroupedAggregateState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LocalUngroupedAggregateState_*,_std::default_delete<duckdb::LocalUngroupedAggregateState>_>
       .super__Head_base<0UL,_duckdb::LocalUngroupedAggregateState_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (LocalUngroupedAggregateState *)0x0) {
    UngroupedAggregateState::~UngroupedAggregateState(&(_Var2._M_head_impl)->state);
    operator_delete(_Var2._M_head_impl);
  }
  (this->state).
  super_unique_ptr<duckdb::LocalUngroupedAggregateState,_std::default_delete<duckdb::LocalUngroupedAggregateState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::LocalUngroupedAggregateState,_std::default_delete<duckdb::LocalUngroupedAggregateState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LocalUngroupedAggregateState_*,_std::default_delete<duckdb::LocalUngroupedAggregateState>_>
  .super__Head_base<0UL,_duckdb::LocalUngroupedAggregateState_*,_false>._M_head_impl =
       (LocalUngroupedAggregateState *)0x0;
  Value::~Value(&this->current_partition);
  (this->super_LocalSinkState)._vptr_LocalSinkState = (_func_int **)&PTR__LocalSinkState_019702a8;
  ::std::vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>::~vector
            (&(this->super_LocalSinkState).partition_info.partition_data.
              super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
            );
  operator_delete(this);
  return;
}

Assistant:

PartitionedAggregateLocalSinkState(const PhysicalPartitionedAggregate &op, const vector<LogicalType> &child_types,
	                                   ExecutionContext &context)
	    : execute_state(context.client, op.aggregates, child_types) {
	}